

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Appearance_PDU::SetAlternateEntityTypeFlag(Appearance_PDU *this,KBOOL F)

{
  KBOOL F_local;
  Appearance_PDU *this_local;
  
  if (F != (KBOOL)((this->m_AppearanceFlag1Union).m_ui8Flag >> 2 & 1)) {
    (this->m_AppearanceFlag1Union).m_ui8Flag =
         (this->m_AppearanceFlag1Union).m_ui8Flag & 0xfb | F << 2;
    if (F) {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength + 8;
    }
    else {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength - 8;
    }
  }
  return;
}

Assistant:

void Appearance_PDU::SetAlternateEntityTypeFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag1Union.m_ui8AltTyp )return;

    m_AppearanceFlag1Union.m_ui8AltTyp = F;

    if( F )
    {
        m_ui16PDULength += EntityType::ENTITY_TYPE_SIZE;
    }
    else
    {
        m_ui16PDULength -= EntityType::ENTITY_TYPE_SIZE;
    }
}